

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void Cmd_quicksave(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  char *filename;
  DMenu *menu;
  FSoundID *this;
  float fVar2;
  DMenu *newmenu;
  FName local_28;
  FSoundID local_24;
  FSoundID local_20;
  int local_1c;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  if ((usergame) && ((0 < (int)(&DAT_01ae7158)[(long)consoleplayer * 0xa8] || (multiplayer)))) {
    if (gamestate == GS_LEVEL) {
      if (quickSaveSlot == (FSaveGameNode *)0x0) {
        FSoundID::FSoundID(&local_24,"menu/activate");
        fVar2 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
        S_Sound(0x22,&local_24,fVar2,0.0);
        M_StartControlPanel(false);
        FName::FName(&local_28,NAME_Savegamemenu);
        M_SetMenu(&local_28,-1);
      }
      else {
        bVar1 = FBoolCVar::operator_cast_to_bool(&saveloadconfirmation);
        if (bVar1) {
          this = (FSoundID *)((long)&newmenu + 4);
          FSoundID::FSoundID(this,"menu/activate");
          fVar2 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
          S_Sound(0x22,this,fVar2,0.0);
          menu = (DMenu *)DObject::operator_new((DObject *)0x50,(size_t)this);
          DQuickSaveMenu::DQuickSaveMenu((DQuickSaveMenu *)menu,false);
          TObjPtr<DMenu>::operator=(&menu->mParentMenu,DMenu::CurrentMenu);
          M_ActivateMenu(menu);
        }
        else {
          filename = FString::GetChars(&quickSaveSlot->Filename);
          G_SaveGame(filename,quickSaveSlot->Title);
        }
      }
    }
  }
  else {
    FSoundID::FSoundID(&local_20,"menu/invalid");
    fVar2 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_20,fVar2,0.0);
  }
  return;
}

Assistant:

CCMD (quicksave)
{	// F6
	if (!usergame || (players[consoleplayer].health <= 0 && !multiplayer))
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/invalid", snd_menuvolume, ATTN_NONE);
		return;
	}

	if (gamestate != GS_LEVEL)
		return;
		
	if (quickSaveSlot == NULL)
	{
		S_Sound(CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
		M_StartControlPanel(false);
		M_SetMenu(NAME_Savegamemenu);
		return;
	}
	
	// [mxd]. Just save the game, no questions asked.
	if (!saveloadconfirmation)
	{
		G_SaveGame(quickSaveSlot->Filename.GetChars(), quickSaveSlot->Title);
		return;
	}

	S_Sound(CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
	DMenu *newmenu = new DQuickSaveMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}